

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::MethodDescriptor::DebugString
          (MethodDescriptor *this,int depth,string *contents,
          DebugStringOptions *debug_string_options)

{
  bool bVar1;
  string *psVar2;
  Descriptor *pDVar3;
  MethodOptions *options;
  ServiceDescriptor *this_00;
  FileDescriptor *this_01;
  DescriptorPool *pool;
  char *pcVar4;
  SubstituteArg local_4d8;
  SubstituteArg local_4a8;
  SubstituteArg local_478;
  SubstituteArg local_448;
  SubstituteArg local_418;
  SubstituteArg local_3e8;
  SubstituteArg local_3b8;
  SubstituteArg local_388;
  SubstituteArg local_358;
  SubstituteArg local_328;
  undefined1 local_2f8 [8];
  string formatted_options;
  SubstituteArg local_2a8;
  SubstituteArg local_278;
  SubstituteArg local_248;
  SubstituteArg local_218;
  SubstituteArg local_1e8;
  SubstituteArg local_1b8;
  SubstituteArg local_188;
  SubstituteArg local_158;
  SubstituteArg local_128;
  undefined1 local_f8 [8];
  SourceLocationCommentPrinter comment_printer;
  allocator local_49;
  undefined1 local_48 [8];
  string prefix;
  DebugStringOptions *debug_string_options_local;
  string *contents_local;
  int depth_local;
  MethodDescriptor *this_local;
  
  prefix.field_2._8_8_ = debug_string_options;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_48,(long)(depth * 2),' ',&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  anon_unknown_1::SourceLocationCommentPrinter::
  SourceLocationCommentPrinter<google::protobuf::MethodDescriptor>
            ((SourceLocationCommentPrinter *)local_f8,this,(string *)local_48,
             (DebugStringOptions *)prefix.field_2._8_8_);
  anon_unknown_1::SourceLocationCommentPrinter::AddPreComment
            ((SourceLocationCommentPrinter *)local_f8,contents);
  strings::internal::SubstituteArg::SubstituteArg(&local_128,(string *)local_48);
  psVar2 = name_abi_cxx11_(this);
  strings::internal::SubstituteArg::SubstituteArg(&local_158,psVar2);
  pDVar3 = input_type(this);
  psVar2 = Descriptor::full_name_abi_cxx11_(pDVar3);
  strings::internal::SubstituteArg::SubstituteArg(&local_188,psVar2);
  pDVar3 = output_type(this);
  psVar2 = Descriptor::full_name_abi_cxx11_(pDVar3);
  strings::internal::SubstituteArg::SubstituteArg(&local_1b8,psVar2);
  bVar1 = client_streaming(this);
  pcVar4 = "";
  if (bVar1) {
    pcVar4 = "stream ";
  }
  strings::internal::SubstituteArg::SubstituteArg(&local_1e8,pcVar4);
  bVar1 = server_streaming(this);
  pcVar4 = "";
  if (bVar1) {
    pcVar4 = "stream ";
  }
  strings::internal::SubstituteArg::SubstituteArg(&local_218,pcVar4);
  strings::internal::SubstituteArg::SubstituteArg(&local_248);
  strings::internal::SubstituteArg::SubstituteArg(&local_278);
  strings::internal::SubstituteArg::SubstituteArg(&local_2a8);
  strings::internal::SubstituteArg::SubstituteArg
            ((SubstituteArg *)((long)&formatted_options.field_2 + 8));
  strings::SubstituteAndAppend
            (contents,"$0rpc $1($4.$2) returns ($5.$3)",&local_128,&local_158,&local_188,&local_1b8,
             &local_1e8,&local_218,&local_248,&local_278,&local_2a8,
             (SubstituteArg *)((long)&formatted_options.field_2 + 8));
  std::__cxx11::string::string((string *)local_2f8);
  options = MethodDescriptor::options(this);
  this_00 = service(this);
  this_01 = ServiceDescriptor::file(this_00);
  pool = FileDescriptor::pool(this_01);
  bVar1 = anon_unknown_1::FormatLineOptions
                    (depth + 1,&options->super_Message,pool,(string *)local_2f8);
  if (bVar1) {
    strings::internal::SubstituteArg::SubstituteArg(&local_328,(string *)local_2f8);
    strings::internal::SubstituteArg::SubstituteArg(&local_358,(string *)local_48);
    strings::internal::SubstituteArg::SubstituteArg(&local_388);
    strings::internal::SubstituteArg::SubstituteArg(&local_3b8);
    strings::internal::SubstituteArg::SubstituteArg(&local_3e8);
    strings::internal::SubstituteArg::SubstituteArg(&local_418);
    strings::internal::SubstituteArg::SubstituteArg(&local_448);
    strings::internal::SubstituteArg::SubstituteArg(&local_478);
    strings::internal::SubstituteArg::SubstituteArg(&local_4a8);
    strings::internal::SubstituteArg::SubstituteArg(&local_4d8);
    strings::SubstituteAndAppend
              (contents," {\n$0$1}\n",&local_328,&local_358,&local_388,&local_3b8,&local_3e8,
               &local_418,&local_448,&local_478,&local_4a8,&local_4d8);
  }
  else {
    std::__cxx11::string::append((char *)contents);
  }
  anon_unknown_1::SourceLocationCommentPrinter::AddPostComment
            ((SourceLocationCommentPrinter *)local_f8,contents);
  std::__cxx11::string::~string((string *)local_2f8);
  anon_unknown_1::SourceLocationCommentPrinter::~SourceLocationCommentPrinter
            ((SourceLocationCommentPrinter *)local_f8);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void MethodDescriptor::DebugString(int depth, string *contents,
                                   const DebugStringOptions&
                                   debug_string_options) const {
  string prefix(depth * 2, ' ');
  ++depth;

  SourceLocationCommentPrinter
      comment_printer(this, prefix, debug_string_options);
  comment_printer.AddPreComment(contents);

  strings::SubstituteAndAppend(contents, "$0rpc $1($4.$2) returns ($5.$3)",
                               prefix, name(),
                               input_type()->full_name(),
                               output_type()->full_name(),
                               client_streaming() ? "stream " : "",
                               server_streaming() ? "stream " : "");

  string formatted_options;
  if (FormatLineOptions(depth, options(), service()->file()->pool(),
                        &formatted_options)) {
    strings::SubstituteAndAppend(contents, " {\n$0$1}\n",
                                 formatted_options, prefix);
  } else {
    contents->append(";\n");
  }

  comment_printer.AddPostComment(contents);
}